

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O1

void __thiscall BayesianGameBase::SanityCheckBGBase(BayesianGameBase *this)

{
  char cVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  ostream *poVar4;
  undefined8 *puVar5;
  _Rb_tree_header *p_Var6;
  ulong uVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double p1;
  undefined1 auVar10 [16];
  stringstream ss;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  stringstream local_198 [16];
  long local_188;
  undefined8 local_180 [13];
  ios_base local_118 [264];
  
  if (this->_m_JToverflow == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "\n!!! BayesianGameBase::SanityCheck() aborted since the joint types are overflowing. BayesianGameBase really is ill-suited for this situation and a new implementation needs to be created for this case!!! Only leaving this now such that we can run experiments for the JAAMAS paper...\n"
               ,0x11a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    return;
  }
  if (this->_m_useSparse == false) {
    if ((this->_m_jTypeProbs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->_m_jTypeProbs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar7 = 0;
      p1 = 0.0;
      do {
        dVar9 = p1;
        (*(this->super_Interface_ProblemToPolicyDiscretePure).
          super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[0xd])
                  (this,uVar7);
        p1 = p1 + dVar9;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (uVar7 < (ulong)((long)(this->_m_jTypeProbs).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(this->_m_jTypeProbs).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 3));
      goto LAB_00374762;
    }
  }
  else {
    p_Var3 = (this->_m_jTypeProbsSparse).data_.
             super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(this->_m_jTypeProbsSparse).data_.
              super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var6) {
      p1 = 0.0;
      do {
        p1 = p1 + (double)p_Var3[1]._M_parent;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var6);
      goto LAB_00374762;
    }
  }
  p1 = 0.0;
LAB_00374762:
  bVar2 = Globals::EqualProbability(p1,1.0);
  if (!bVar2) {
    std::__cxx11::stringstream::stringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188,
               "BayesianGameBase::SanityCheck() Warning, total probability of joint types does not sum to 1.0, "
               ,0x5f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_188,"but to ",7);
    *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 0x10;
    poVar4 = std::ostream::_M_insert<double>(p1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"! ",2);
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = p1 + -1.0;
    auVar8 = vandpd_avx512vl(auVar10,auVar8);
    if (1e-09 <= auVar8._0_8_) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
      *puVar5 = &PTR__E_0059bd80;
      std::__cxx11::stringbuf::str();
      __cxa_throw(puVar5,&E::typeinfo,E::~E);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188,
               "Since the difference is < 1e-9, we should just renormalize... (not yet implemented...)"
               ,0x56);
    cVar1 = (char)(ostream *)&local_188;
    std::ios::widen((char)*(undefined8 *)(local_188 + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)local_1b8,local_1b0);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_198);
    std::ios_base::~ios_base(local_118);
  }
  return;
}

Assistant:

void
BayesianGameBase::SanityCheckBGBase()
{
    double p=0.0;
    if (_m_JToverflow)
    {
        cout << "\n!!! BayesianGameBase::SanityCheck() aborted since the joint types are overflowing. BayesianGameBase really is ill-suited for this situation and a new implementation needs to be created for this case!!! Only leaving this now such that we can run experiments for the JAAMAS paper...\n"<< endl;
        return;
    }

    if(_m_useSparse)
    {
        for( SparseVector::const_iterator it = _m_jTypeProbsSparse.begin(); 
                it != _m_jTypeProbsSparse.end();
                it++)
            p += *it;
        //throw E("BayesianGameBase::SanityCheck() not yet implemented for sparse stuff");

    }
    else
    {
        for(Index jtI=0; jtI < _m_jTypeProbs.size(); jtI++)
            p += GetProbability(jtI);
    }

    if(! Globals::EqualProbability(p, 1.0) )
    {
        stringstream ss;
        ss << "BayesianGameBase::SanityCheck() Warning, total probability of joint types does not sum to 1.0, "
            << "but to "<<setprecision(16) << p<<"! ";
        if(  abs(p - 1.0) < 1e-9  )
        {
            ss << "Since the difference is < 1e-9, we should just renormalize... (not yet implemented...)"<<endl;
            cerr << ss.str();
        }
        else
            throw(E(ss));
    }
    return;
}